

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceMemoryBase.hpp
# Opt level: O2

void __thiscall
Diligent::DeviceMemoryBase<Diligent::EngineVkImplTraits>::DvpVerifyResize
          (DeviceMemoryBase<Diligent::EngineVkImplTraits> *this,Uint64 NewSize)

{
  char (*in_stack_ffffffffffffffc8) [2];
  Uint64 NewSize_local;
  string msg;
  
  if (NewSize % (this->
                super_DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
                ).m_Desc.PageSize != 0) {
    NewSize_local = NewSize;
    FormatString<char[10],unsigned_long,char[41],unsigned_long,char[2]>
              (&msg,(Diligent *)"NewSize (",(char (*) [10])&NewSize_local,
               (unsigned_long *)") must be  a multiple of the page size (",
               (char (*) [41])
               &(this->
                super_DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
                ).m_Desc.PageSize,(unsigned_long *)0x647201,in_stack_ffffffffffffffc8);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"DvpVerifyResize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceMemoryBase.hpp"
               ,0x54);
    std::__cxx11::string::~string((string *)&msg);
  }
  return;
}

Assistant:

void DvpVerifyResize(Uint64 NewSize) const
    {
        DEV_CHECK_ERR((NewSize % this->m_Desc.PageSize) == 0,
                      "NewSize (", NewSize, ") must be  a multiple of the page size (", this->m_Desc.PageSize, ")");
    }